

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowNaiveState::FlushStates(WindowNaiveState *this,WindowAggregatorGlobalState *gsink)

{
  Vector *pVVar1;
  pointer pWVar2;
  FunctionDataWrapper *pFVar3;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var4;
  AggregateInputData aggr_input_data;
  AggregateInputData local_30;
  
  if (this->flush_count != 0) {
    pWVar2 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator->(&(this->super_WindowAggregatorLocalState).cursor);
    _Var4._M_head_impl = (FunctionData *)0x0;
    DataChunk::Slice(&this->leaves,&pWVar2->chunk,&this->update_sel,this->flush_count,0);
    if ((gsink->aggr).bind_data_wrapper.internal.
        super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pFVar3 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                         (&(gsink->aggr).bind_data_wrapper);
      _Var4._M_head_impl =
           (pFVar3->function_data).
           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    local_30.allocator =
         &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
    local_30.combine_type = PRESERVE_INPUT;
    pVVar1 = (this->leaves).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_30.bind_data.ptr = _Var4._M_head_impl;
    (*(gsink->aggr).function.update)
              (pVVar1,&local_30,
               ((long)(this->leaves).data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5,
               &this->statep,this->flush_count);
    this->flush_count = 0;
  }
  return;
}

Assistant:

void WindowNaiveState::FlushStates(const WindowAggregatorGlobalState &gsink) {
	if (!flush_count) {
		return;
	}

	auto &scanned = cursor->chunk;
	leaves.Slice(scanned, update_sel, flush_count);

	const auto &aggr = gsink.aggr;
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), statep, flush_count);

	flush_count = 0;
}